

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *focus_window;
  ImGuiWindow *window;
  int i;
  int under_this_window_idx;
  int start_idx;
  ImGuiContext *g;
  ImGuiWindow *ignore_window_local;
  ImGuiWindow *under_this_window_local;
  
  pIVar1 = GImGui;
  i = (GImGui->WindowsFocusOrder).Size + -1;
  if ((under_this_window != (ImGuiWindow *)0x0) &&
     (iVar2 = FindWindowFocusIndex(under_this_window), iVar2 != -1)) {
    i = iVar2 + -1;
  }
  window._4_4_ = i;
  while( true ) {
    if (window._4_4_ < 0) {
      FocusWindow((ImGuiWindow *)0x0);
      return;
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,window._4_4_);
    pIVar4 = *ppIVar3;
    if ((((pIVar4 != ignore_window) && ((pIVar4->WasActive & 1U) != 0)) &&
        (pIVar4->RootWindowDockStop == pIVar4)) && ((pIVar4->Flags & 0x40200U) != 0x40200)) break;
    window._4_4_ = window._4_4_ + -1;
  }
  pIVar4 = NavRestoreLastChildNavWindow(pIVar4);
  FocusWindow(pIVar4);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        int under_this_window_idx = FindWindowFocusIndex(under_this_window);
        if (under_this_window_idx != -1)
            start_idx = under_this_window_idx - 1;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && window->RootWindowDockStop == window)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                // FIXME-DOCK: This is failing (lagging by one frame) for docked windows.
                // If A and B are docked into window and B disappear, at the NewFrame() call site window->NavLastChildNavWindow will still point to B.
                // We might leverage the tab order implicitly stored in window->DockNodeAsHost->TabBar (essentially the 'most_recently_selected_tab' code in tab bar will do that but on next update)
                // to tell which is the "previous" window. Or we may leverage 'LastFrameFocused/LastFrameJustFocused' and have this function handle child window itself?
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}